

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_r6_muldiv(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *s;
  TCGTemp *pTVar1;
  TCGTemp *pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGv_i32 pTVar5;
  uintptr_t o_2;
  TCGOpcode opc_00;
  uintptr_t o_3;
  TCGv_i64 arg1;
  TCGv_i64 ret;
  TCGv_i32 ret_00;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (rd == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg1 = (TCGv_i64)((long)pTVar1 - (long)s);
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  if (rs == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar1,0);
  }
  else if (s->cpu_gpr[rs] != arg1) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar1,(TCGArg)(s->cpu_gpr[rs] + (long)s));
  }
  ret = (TCGv_i64)((long)pTVar2 - (long)s);
  if (rt == 0) {
    opc_00 = INDEX_op_movi_i64;
    pTVar4 = (TCGv_i64)0x0;
LAB_0097eb1a:
    tcg_gen_op2_mips64el(s,opc_00,(TCGArg)pTVar2,(TCGArg)pTVar4);
  }
  else if (s->cpu_gpr[rt] != ret) {
    pTVar4 = s->cpu_gpr[rt] + (long)s;
    opc_00 = INDEX_op_mov_i64;
    goto LAB_0097eb1a;
  }
  switch(opc) {
  case 0x98:
  case 0x99:
    local_48 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_mips64el(s,(TCGv_i32)((long)local_48 - (long)s),arg1);
    tcg_gen_extrl_i64_i32_mips64el(s,(TCGv_i32)((long)pTVar1 - (long)s),ret);
    tcg_gen_op3_mips64el(s,INDEX_op_mul_i32,(TCGArg)local_48,(TCGArg)local_48,(TCGArg)pTVar1);
    tcg_gen_ext_i32_i64_mips64el(s,s->cpu_gpr[rd],(TCGv_i32)((long)local_48 - (long)s));
    goto LAB_0097f1b3;
  case 0x9a:
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = (TCGv_i64)((long)pTVar1 - (long)s);
    local_40 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)local_40 - (long)s);
    tcg_gen_ext32s_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32s_i64_mips64el(s,ret,ret);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar3,arg1,-0x80000000);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,-1);
    tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)local_40);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,0);
    tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)local_40);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,0);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,ret,pTVar3,pTVar4,pTVar3,ret);
    tcg_gen_div_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
LAB_0097ef0d:
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[rd],s->cpu_gpr[rd]);
    tcg_temp_free_internal_mips64el(s,local_40);
    break;
  case 0x9b:
    pTVar4 = tcg_const_i64_mips64el(s,0);
    pTVar3 = tcg_const_i64_mips64el(s,1);
    tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
    tcg_gen_ext32u_i64_mips64el(s,ret,ret);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,ret,ret,pTVar4,pTVar3,ret);
    tcg_gen_divu_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
LAB_0097f085:
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[rd],s->cpu_gpr[rd]);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
    goto LAB_0097f123;
  case 0x9c:
  case 0x9d:
    tcg_gen_op3_mips64el
              (s,INDEX_op_mul_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[rd]),(TCGArg)pTVar1
               ,(TCGArg)pTVar2);
    goto LAB_0097f424;
  case 0x9e:
    pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar3 = (TCGv_i64)((long)pTVar1 - (long)s);
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar4 = (TCGv_i64)((long)pTVar2 - (long)s);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar3,arg1,-0x8000000000000000);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,-1);
    tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
    tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,0);
    tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,ret,pTVar3,pTVar4,pTVar3,ret);
    tcg_gen_div_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
LAB_0097f40e:
    tcg_temp_free_internal_mips64el(s,pTVar2);
    break;
  case 0x9f:
    pTVar4 = tcg_const_i64_mips64el(s,0);
    pTVar3 = tcg_const_i64_mips64el(s,1);
    tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,ret,ret,pTVar4,pTVar3,ret);
    tcg_gen_divu_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
LAB_0097f10c:
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
LAB_0097f123:
    pTVar1 = (TCGTemp *)(pTVar4 + (long)s);
    break;
  default:
    switch(opc) {
    case 0xd8:
      local_48 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)local_48 - (long)s);
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      ret_00 = (TCGv_i32)((long)pTVar1 - (long)s);
      tcg_gen_extrl_i64_i32_mips64el(s,pTVar5,arg1);
      tcg_gen_extrl_i64_i32_mips64el(s,ret_00,ret);
      tcg_gen_muls2_i32_mips64el(s,pTVar5,ret_00,pTVar5,ret_00);
      goto LAB_0097f190;
    case 0xd9:
      local_48 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)local_48 - (long)s);
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
      ret_00 = (TCGv_i32)((long)pTVar1 - (long)s);
      tcg_gen_extrl_i64_i32_mips64el(s,pTVar5,arg1);
      tcg_gen_extrl_i64_i32_mips64el(s,ret_00,ret);
      tcg_gen_mulu2_i32_mips64el(s,pTVar5,ret_00,pTVar5,ret_00);
LAB_0097f190:
      tcg_gen_ext_i32_i64_mips64el(s,s->cpu_gpr[rd],ret_00);
LAB_0097f1b3:
      tcg_temp_free_internal_mips64el(s,local_48);
      break;
    case 0xda:
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar1 - (long)s);
      local_40 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar4 = (TCGv_i64)((long)local_40 - (long)s);
      tcg_gen_ext32s_i64_mips64el(s,arg1,arg1);
      tcg_gen_ext32s_i64_mips64el(s,ret,ret);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar3,arg1,-0x80000000);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,-1);
      tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)local_40);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,0);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)local_40);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)local_40,0);
      tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,ret,pTVar3,pTVar4,pTVar3,ret);
      tcg_gen_rem_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
      goto LAB_0097ef0d;
    case 0xdb:
      pTVar4 = tcg_const_i64_mips64el(s,0);
      pTVar3 = tcg_const_i64_mips64el(s,1);
      tcg_gen_ext32u_i64_mips64el(s,arg1,arg1);
      tcg_gen_ext32u_i64_mips64el(s,ret,ret);
      tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,ret,ret,pTVar4,pTVar3,ret);
      tcg_gen_remu_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
      goto LAB_0097f085;
    case 0xdc:
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      tcg_gen_muls2_i64_mips64el(s,(TCGv_i64)((long)pTVar1 - (long)s),s->cpu_gpr[rd],arg1,ret);
      break;
    case 0xdd:
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      tcg_gen_mulu2_i64_mips64el(s,(TCGv_i64)((long)pTVar1 - (long)s),s->cpu_gpr[rd],arg1,ret);
      break;
    case 0xde:
      pTVar1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar1 - (long)s);
      pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
      pTVar4 = (TCGv_i64)((long)pTVar2 - (long)s);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar3,arg1,-0x8000000000000000);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,-1);
      tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
      tcg_gen_setcondi_i64_mips64el(s,TCG_COND_EQ,pTVar4,ret,0);
      tcg_gen_op3_mips64el(s,INDEX_op_or_i64,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)pTVar2);
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar2,0);
      tcg_gen_movcond_i64_mips64el(s,TCG_COND_NE,ret,pTVar3,pTVar4,pTVar3,ret);
      tcg_gen_rem_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
      goto LAB_0097f40e;
    case 0xdf:
      pTVar4 = tcg_const_i64_mips64el(s,0);
      pTVar3 = tcg_const_i64_mips64el(s,1);
      tcg_gen_movcond_i64_mips64el(s,TCG_COND_EQ,ret,ret,pTVar4,pTVar3,ret);
      tcg_gen_remu_i64_mips64el(s,s->cpu_gpr[rd],arg1,ret);
      goto LAB_0097f10c;
    default:
      generate_exception_err(ctx,0x14,0);
      goto LAB_0097f424;
    }
  }
  tcg_temp_free_internal_mips64el(s,pTVar1);
LAB_0097f424:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg1 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  return;
}

Assistant:

static void gen_r6_muldiv(DisasContext *ctx, int opc, int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case R6_OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MUL:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUH:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MULU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUHU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case R6_OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMUL:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUH:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_muls2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMULU:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUHU:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_mulu2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
#endif
    default:
        MIPS_INVAL("r6 mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}